

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_read_format_zip.c
# Opt level: O1

void test_read_format_zip_lzma_alone_leak(void)

{
  int iVar1;
  wchar_t wVar2;
  archive_conflict *a;
  la_ssize_t lVar3;
  archive_entry *ae;
  char buf [64];
  archive_entry *local_80;
  undefined1 local_78 [72];
  
  extract_reference_file("test_read_format_zip_lzma_alone_leak.zipx");
  a = (archive_conflict *)archive_read_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip.c"
                   ,L'Ϻ',(uint)(a != (archive_conflict *)0x0),"(a = archive_read_new()) != NULL",
                   (void *)0x0);
  iVar1 = archive_read_support_filter_lzma((archive *)a);
  if (iVar1 != 0) {
    skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip.c"
                   ,L'ϼ');
    test_skipping("lzma reading is not fully supported on this platform");
    archive_read_close((archive *)a);
    archive_read_free((archive *)a);
    return;
  }
  wVar2 = archive_read_support_format_zip((archive *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip.c"
                      ,L'Ђ',0,"ARCHIVE_OK",(long)wVar2,"archive_read_support_format_zip(a)",a);
  wVar2 = archive_read_open_filename(a,"test_read_format_zip_lzma_alone_leak.zipx",0x25);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip.c"
                      ,L'Ѓ',0,"ARCHIVE_OK",(long)wVar2,"archive_read_open_filename(a, refname, 37)"
                      ,a);
  iVar1 = archive_read_next_header((archive *)a,&local_80);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip.c"
                      ,L'Є',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",a);
  lVar3 = archive_read_data((archive *)a,local_78,0x40);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip.c"
                      ,L'Ј',-0x19,"ARCHIVE_FAILED",lVar3,"archive_read_data(a, buf, sizeof(buf))",a
                     );
  iVar1 = archive_read_next_header((archive *)a,&local_80);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip.c"
                      ,L'Љ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",a);
  lVar3 = archive_read_data((archive *)a,local_78,0x40);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip.c"
                      ,L'Ѝ',-0x1e,"ARCHIVE_FATAL",lVar3,"archive_read_data(a, buf, sizeof(buf))",a)
  ;
  iVar1 = archive_read_close((archive *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip.c"
                      ,L'Џ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_close(a)",a);
  iVar1 = archive_read_free((archive *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip.c"
                      ,L'А',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",a);
  return;
}

Assistant:

DEFINE_TEST(test_read_format_zip_lzma_alone_leak)
{
	const char *refname = "test_read_format_zip_lzma_alone_leak.zipx";
	struct archive *a;
	struct archive_entry *ae;
	char buf[64];

	/* OSSFuzz #14470 sample file. */
	extract_reference_file(refname);

	assert((a = archive_read_new()) != NULL);
	if(ARCHIVE_OK != archive_read_support_filter_lzma(a)) {
		skipping("lzma reading is not fully supported on this platform");
		archive_read_close(a);
		archive_read_free(a);
		return;
	}

	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_format_zip(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_open_filename(a, refname, 37));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));

	/* Extraction of this file should fail, because the sample file is invalid.
	 * But it shouldn't crash. */
	assertEqualIntA(a, ARCHIVE_FAILED, archive_read_data(a, buf, sizeof(buf)));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));

	/* Extraction of this file should fail, because the sample file is invalid.
	 * But it shouldn't crash. */
	assertEqualIntA(a, ARCHIVE_FATAL, archive_read_data(a, buf, sizeof(buf)));

	assertEqualIntA(a, ARCHIVE_OK, archive_read_close(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_free(a));

	/* This testcase shouldn't produce any memory leaks. When running test
	 * suite under Valgrind or ASan, the test runner won't return with
	 * exit code 0 in case if a memory leak. */
}